

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::sort_initial_stmts(Generator *top)

{
  undefined1 local_58 [8];
  SortInitialVisitor v;
  Generator *top_local;
  
  v.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  SortInitialVisitor::SortInitialVisitor((SortInitialVisitor *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,(Generator *)v.super_IRVisitor.visited_._M_h._M_single_bucket);
  SortInitialVisitor::~SortInitialVisitor((SortInitialVisitor *)local_58);
  return;
}

Assistant:

void sort_initial_stmts(Generator* top) {
    SortInitialVisitor v;
    v.visit_generator_root_p(top);
}